

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::InternReadFile
          (COBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  _Map_pointer ppsVar1;
  uint *puVar2;
  uint *puVar3;
  Type TVar4;
  element_type *peVar5;
  _Elt_pointer ppNVar6;
  element_type *peVar7;
  _Elt_pointer psVar8;
  int iVar9;
  __uniq_ptr_data<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>,_true,_true>
  this_00;
  undefined4 extraout_var;
  Logger *this_01;
  deque<Assimp::COB::Face*,std::allocator<Assimp::COB::Face*>> *this_02;
  _Map_pointer ppsVar10;
  aiMesh **__s;
  aiMaterial **__s_00;
  aiLight **__s_01;
  aiCamera **__s_02;
  Node *root;
  size_type sVar11;
  reference psVar12;
  aiNode *paVar13;
  _Elt_pointer psVar14;
  uint *puVar15;
  _Elt_pointer psVar16;
  ulong uVar17;
  size_t m;
  _Elt_pointer psVar18;
  ulong __n;
  Face *f;
  _Elt_pointer __k;
  size_t n_1;
  _Elt_pointer psVar19;
  _Map_pointer local_2c8;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  stream;
  char head [32];
  char *local_288 [4];
  char *local_268;
  undefined8 local_260;
  char local_258 [4];
  char local_254 [2];
  undefined1 local_252;
  Scene scene;
  FlipWindingOrderProcess flip;
  
  COB::Scene::Scene(&scene);
  this_00.
  super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
        )operator_new(0x38);
  std::__cxx11::string::string((string *)&flip,"rb",(allocator *)head);
  iVar9 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,flip.super_BaseProcess._vptr_BaseProcess);
  StreamReader<false,_false>::StreamReader
            ((StreamReader<false,_false> *)
             this_00.
             super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
             .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl,
             (IOStream *)CONCAT44(extraout_var,iVar9),false);
  stream._M_t.
  super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>,_true,_true>
        )(__uniq_ptr_data<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
           .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl;
  std::__cxx11::string::~string((string *)&flip);
  StreamReader<false,_false>::CopyAndAdvance
            ((StreamReader<false,_false> *)
             stream._M_t.
             super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
             .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl,head,
             0x20);
  iVar9 = bcmp(head,"Caligari ",9);
  if (iVar9 != 0) {
    std::__cxx11::string::string
              ((string *)&flip,"Could not found magic id: `Caligari`",(allocator *)local_288);
    ThrowException((string *)&flip);
  }
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[18]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&flip,
             (char (*) [18])"File format tag: ");
  local_268 = local_258;
  local_258[0] = head[9];
  local_258[1] = head[10];
  local_258[2] = head[0xb];
  local_258[3] = head[0xc];
  local_254[0] = head[0xd];
  local_254[1] = head[0xe];
  local_260 = 6;
  local_252 = 0;
  std::operator<<((ostream *)&flip,(string *)&local_268);
  std::__cxx11::stringbuf::str();
  Logger::info(this_01,local_288[0]);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&flip);
  if (head[0x10] == 'L') {
    if (head[0xf] == 'A') {
      ReadAsciiFile(this,&scene,
                    (StreamReaderLE *)
                    stream._M_t.
                    super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                    .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>._M_head_impl
                   );
    }
    else {
      ReadBinaryFile(this,&scene,
                     (StreamReaderLE *)
                     stream._M_t.
                     super___uniq_ptr_impl<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::StreamReader<false,_false>_*,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
                     .super__Head_base<0UL,_Assimp::StreamReader<false,_false>_*,_false>.
                     _M_head_impl);
    }
    psVar8 = scene.nodes.
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (scene.nodes.
        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        scene.nodes.
        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_2c8 = scene.nodes.
                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
      psVar18 = scene.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar19 = scene.nodes.
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      while (ppsVar10 = scene.nodes.
                        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node,
            psVar14 = scene.nodes.
                      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,
            psVar16 = scene.nodes.
                      super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last, psVar18 != psVar8) {
        peVar5 = (psVar18->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if (peVar5->type == TYPE_MESH) {
          ppNVar6 = peVar5[1].temp_children.
                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
          for (__k = peVar5[1].temp_children.
                     super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur; __k != ppNVar6; __k = __k + 4)
          {
            this_02 = (deque<Assimp::COB::Face*,std::allocator<Assimp::COB::Face*>> *)
                      std::
                      map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                      ::operator[]((map<unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>_>_>_>
                                    *)&peVar5[1].temp_children.
                                       super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                       ._M_impl.super__Deque_impl_data._M_finish,(key_type *)__k);
            flip.super_BaseProcess._vptr_BaseProcess = (_func_int **)__k;
            std::deque<Assimp::COB::Face*,std::allocator<Assimp::COB::Face*>>::
            emplace_back<Assimp::COB::Face*>(this_02,(Face **)&flip);
          }
        }
        psVar18 = psVar18 + 1;
        if (psVar18 == psVar19) {
          psVar18 = local_2c8[1];
          local_2c8 = local_2c8 + 1;
          psVar19 = psVar18 + 0x20;
        }
      }
      while (psVar14 !=
             scene.nodes.
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        peVar5 = (psVar14->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if (((peVar5->type == TYPE_MESH) &&
            (peVar5[1].temp_children.
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&peVar5[1].type)) &&
           (*(_func_int ***)&peVar5[1].super_ChunkInfo != peVar5[1]._vptr_Node)) {
          pScene->mNumMeshes = pScene->mNumMeshes + (int)peVar5[1].name._M_string_length;
        }
        psVar14 = psVar14 + 1;
        if (psVar14 == psVar16) {
          ppsVar1 = ppsVar10 + 1;
          ppsVar10 = ppsVar10 + 1;
          psVar14 = *ppsVar1;
          psVar16 = *ppsVar1 + 0x20;
        }
      }
      uVar17 = (ulong)pScene->mNumMeshes << 3;
      __s = (aiMesh **)operator_new__(uVar17);
      memset(__s,0,uVar17);
      pScene->mMeshes = __s;
      __s_00 = (aiMaterial **)operator_new__(uVar17);
      memset(__s_00,0,uVar17);
      pScene->mMaterials = __s_00;
      pScene->mNumMeshes = 0;
      puVar2 = &pScene->mNumCameras;
      puVar3 = &pScene->mNumLights;
      while (scene.nodes.
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur !=
             scene.nodes.
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        TVar4 = (((scene.nodes.
                   super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                 super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type;
        puVar15 = puVar3;
        if ((TVar4 == TYPE_LIGHT) || (puVar15 = puVar2, TVar4 == TYPE_CAMERA)) {
          *puVar15 = *puVar15 + 1;
        }
        scene.nodes.
        super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur =
             scene.nodes.
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        if (scene.nodes.
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur ==
            scene.nodes.
            super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last) {
          scene.nodes.
          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur =
               scene.nodes.
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[1];
          scene.nodes.
          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node =
               scene.nodes.
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          scene.nodes.
          super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_last =
               scene.nodes.
               super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
        }
      }
      if ((ulong)*puVar3 != 0) {
        uVar17 = (ulong)*puVar3 << 3;
        __s_01 = (aiLight **)operator_new__(uVar17);
        memset(__s_01,0,uVar17);
        pScene->mLights = __s_01;
      }
      if ((ulong)*puVar2 != 0) {
        uVar17 = (ulong)*puVar2 << 3;
        __s_02 = (aiCamera **)operator_new__(uVar17);
        memset(__s_02,0,uVar17);
        pScene->mCameras = __s_02;
      }
      *puVar2 = 0;
      *puVar3 = 0;
      root = (Node *)operator_new(0xd8);
      COB::Group::Group((Group *)root);
      for (uVar17 = 0;
          sVar11 = std::
                   deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                   ::size(&scene.nodes), uVar17 < sVar11; uVar17 = uVar17 + 1) {
        psVar12 = std::
                  _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                  ::operator[](&scene.nodes.
                                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                ._M_impl.super__Deque_impl_data._M_start,uVar17);
        peVar5 = (psVar12->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        if ((peVar5->super_ChunkInfo).parent_id == 0) {
          flip.super_BaseProcess._vptr_BaseProcess = (_func_int **)peVar5;
          std::deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>>::
          emplace_back<Assimp::COB::Node_const*>
                    ((deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>> *)
                     &root->temp_children,(Node **)&flip);
        }
        for (__n = uVar17;
            sVar11 = std::
                     deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                     ::size(&scene.nodes), __n < sVar11; __n = __n + 1) {
          psVar12 = std::
                    _Deque_iterator<std::shared_ptr<Assimp::COB::Node>,_std::shared_ptr<Assimp::COB::Node>_&,_std::shared_ptr<Assimp::COB::Node>_*>
                    ::operator[](&scene.nodes.
                                  super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start,__n);
          peVar7 = (psVar12->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if ((peVar7->super_ChunkInfo).parent_id == (peVar5->super_ChunkInfo).id) {
            flip.super_BaseProcess._vptr_BaseProcess = (_func_int **)peVar7;
            std::deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>>::
            emplace_back<Assimp::COB::Node_const*>
                      ((deque<Assimp::COB::Node_const*,std::allocator<Assimp::COB::Node_const*>> *)
                       &peVar5->temp_children,(Node **)&flip);
          }
        }
      }
      paVar13 = BuildNodes(this,root,&scene,pScene);
      pScene->mRootNode = paVar13;
      FlipWindingOrderProcess::FlipWindingOrderProcess(&flip);
      FlipWindingOrderProcess::Execute(&flip,pScene);
      FlipWindingOrderProcess::~FlipWindingOrderProcess(&flip);
      (*root->_vptr_Node[1])(root);
      std::
      unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      ::~unique_ptr(&stream);
      COB::Scene::~Scene(&scene);
      return;
    }
    std::__cxx11::string::string((string *)&flip,"No nodes loaded",(allocator *)local_288);
    ThrowException((string *)&flip);
  }
  std::__cxx11::string::string
            ((string *)&flip,"File is big-endian, which is not supported",(allocator *)local_288);
  ThrowException((string *)&flip);
}

Assistant:

void COBImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    COB::Scene scene;
    std::unique_ptr<StreamReaderLE> stream(new StreamReaderLE( pIOHandler->Open(pFile,"rb")) );

    // check header
    char head[32];
    stream->CopyAndAdvance(head,32);
    if (strncmp(head,"Caligari ",9) != 0) {
        ThrowException("Could not found magic id: `Caligari`");
    }

    ASSIMP_LOG_INFO_F("File format tag: ",std::string(head+9,6));
    if (head[16]!='L') {
        ThrowException("File is big-endian, which is not supported");
    }

    // load data into intermediate structures
    if (head[15]=='A') {
        ReadAsciiFile(scene, stream.get());
    }
    else {
        ReadBinaryFile(scene, stream.get());
    }
    if(scene.nodes.empty()) {
        ThrowException("No nodes loaded");
    }

    // sort faces by material indices
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_MESH) {
            Mesh& mesh = (Mesh&)(*n.get());
            for(Face& f : mesh.faces) {
                mesh.temp_map[f.material].push_back(&f);
            }
        }
    }

    // count meshes
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_MESH) {
            Mesh& mesh = (Mesh&)(*n.get());
            if (mesh.vertex_positions.size() && mesh.texture_coords.size()) {
                pScene->mNumMeshes += static_cast<unsigned int>(mesh.temp_map.size());
            }
        }
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes]();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes]();
    pScene->mNumMeshes = 0;

    // count lights and cameras
    for(std::shared_ptr< Node >& n : scene.nodes) {
        if (n->type == Node::TYPE_LIGHT) {
            ++pScene->mNumLights;
        }
        else if (n->type == Node::TYPE_CAMERA) {
            ++pScene->mNumCameras;
        }
    }

    if (pScene->mNumLights) {
        pScene->mLights  = new aiLight*[pScene->mNumLights]();
    }
    if (pScene->mNumCameras) {
        pScene->mCameras = new aiCamera*[pScene->mNumCameras]();
    }
    pScene->mNumLights = pScene->mNumCameras = 0;

    // resolve parents by their IDs and build the output graph
    std::unique_ptr<Node> root(new Group());
    for(size_t n = 0; n < scene.nodes.size(); ++n) {
        const Node& nn = *scene.nodes[n].get();
        if(nn.parent_id==0) {
            root->temp_children.push_back(&nn);
        }

        for(size_t m = n; m < scene.nodes.size(); ++m) {
            const Node& mm = *scene.nodes[m].get();
            if (mm.parent_id == nn.id) {
                nn.temp_children.push_back(&mm);
            }
        }
    }

    pScene->mRootNode = BuildNodes(*root.get(),scene,pScene);
	//flip normals after import
    FlipWindingOrderProcess flip;
    flip.Execute( pScene );
}